

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

void __thiscall SkylineBinPack::MergeSkylines(SkylineBinPack *this)

{
  int iVar1;
  uint uVar2;
  SkylineNode *pSVar3;
  uint local_14;
  uint i;
  SkylineBinPack *this_local;
  
  local_14 = 0;
  while( true ) {
    uVar2 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Size(&this->skyLine);
    if (uVar2 - 1 <= local_14) break;
    pSVar3 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)local_14);
    iVar1 = pSVar3->y;
    pSVar3 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(ulong)(local_14 + 1));
    if (iVar1 == pSVar3->y) {
      pSVar3 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(ulong)(local_14 + 1));
      iVar1 = pSVar3->width;
      pSVar3 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(ulong)local_14);
      pSVar3->width = iVar1 + pSVar3->width;
      TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Delete
                (&this->skyLine,local_14 + 1);
      local_14 = local_14 - 1;
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void SkylineBinPack::MergeSkylines()
{
	for(unsigned i = 0; i < skyLine.Size()-1; ++i)
		if (skyLine[i].y == skyLine[i+1].y)
		{
			skyLine[i].width += skyLine[i+1].width;
			skyLine.Delete(i+1);
			--i;
		}
}